

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

size_t singleTableUsage(poptContext con,FILE *fp,columns_t columns,poptOption *opt,
                       char *translation_domain,poptDone done)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  poptOption *ppVar4;
  poptOption *ppVar5;
  size_t sVar6;
  poptOption *columns_00;
  ulong uVar7;
  ulong uVar8;
  char *translation_domain_00;
  
  if (columns != (columns_t)0x0) {
    for (; ((((poptOption *)columns)->longName != (char *)0x0 ||
            (((poptOption *)columns)->shortName != '\0')) ||
           (((poptOption *)columns)->arg != (void *)0x0));
        columns = (columns_t)((long)columns + 0x30)) {
      uVar1 = ((poptOption *)columns)->argInfo;
      if ((_poptArgMask & uVar1) == 4) {
        columns_00 = (poptOption *)((poptOption *)columns)->arg;
        ppVar5 = columns_00;
        if (columns_00 == poptHelpOptions) {
          ppVar5 = poptHelpOptionsI18N;
        }
        if (translation_domain == (char *)0x0) {
          translation_domain_00 = (char *)0x0;
LAB_00106969:
          sVar6 = singleTableUsage(con,fp,(columns_t)columns_00,opt,translation_domain_00,done);
LAB_0010698b:
          *(size_t *)fp = sVar6;
        }
        else {
          lVar3 = *(long *)(translation_domain + 8);
          uVar8 = 0;
          if ((lVar3 != 0) && (uVar1 = *(uint *)translation_domain, 0 < (int)uVar1)) {
            uVar7 = 0;
            do {
              ppVar4 = *(poptOption **)(lVar3 + uVar7 * 8);
              if ((ppVar4 != (poptOption *)0x0) && (uVar8 = uVar7, ppVar4 == ppVar5)) break;
              uVar7 = uVar7 + 1;
              uVar8 = (ulong)uVar1;
            } while (uVar1 != uVar7);
          }
          if (ppVar5 != (poptOption *)0x0) {
            iVar2 = *(int *)translation_domain;
            if (iVar2 <= (int)uVar8) {
              translation_domain_00 = translation_domain;
              if ((lVar3 != 0) && (iVar2 < *(int *)(translation_domain + 4))) {
                *(int *)translation_domain = iVar2 + 1;
                *(poptOption **)(lVar3 + (long)iVar2 * 8) = ppVar5;
                columns_00 = (poptOption *)((poptOption *)columns)->arg;
              }
              goto LAB_00106969;
            }
          }
        }
      }
      else if ((_poptArgMask & uVar1) == 6) {
        opt = (poptOption *)((poptOption *)columns)->arg;
      }
      else if (((poptOption *)columns)->longName == (char *)0x0) {
        if (((uVar1 >> 0x1e & 1) == 0) && (((poptOption *)columns)->shortName != '\0'))
        goto LAB_0010697d;
      }
      else if ((uVar1 >> 0x1e & 1) == 0) {
LAB_0010697d:
        sVar6 = singleOptionUsage((FILE *)con,(columns_t)fp,(poptOption *)columns,
                                  (char *)(ulong)uVar1);
        goto LAB_0010698b;
      }
    }
  }
  return *(size_t *)fp;
}

Assistant:

static size_t singleTableUsage(poptContext con, FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain,
		poptDone done)
{
    if (opt != NULL)
    for (; (opt->longName || opt->shortName || opt->arg) ; opt++) {
        if (poptArgType(opt) == POPT_ARG_INTL_DOMAIN) {
	    translation_domain = (const char *)opt->arg;
	} else
	if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (done) {
		int i = 0;
		if (done->opts != NULL)
		for (i = 0; i < done->nopts; i++) {
		    const void * that = done->opts[i];
		    if (that == NULL || that != arg)
			continue;
		    break;
		}
		/* Skip if this table has already been processed. */
		if (arg == NULL || i < done->nopts)
		    continue;
		if (done->opts != NULL && done->nopts < done->maxopts)
		    done->opts[done->nopts++] = (const void *) arg;
	    }
	    columns->cur = singleTableUsage(con, fp, columns, opt->arg,
			translation_domain, done);
	} else
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN)) {
	    columns->cur = singleOptionUsage(fp, columns, opt, translation_domain);
	}
    }

    return columns->cur;
}